

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on<bool>
          (reporter<boost::ext::ut::v1_1_8::printer> *this,assertion_fail<bool> assertion)

{
  undefined1 *this_00;
  size_t *psVar1;
  uint *puVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  char local_2b [3];
  
  this_00 = &(this->printer_).field_0x40;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n  ",3);
  sVar4 = strlen(assertion.location.file_);
  sVar5 = sVar4;
  if (sVar4 == 0) {
    sVar4 = 0;
  }
  else {
    do {
      if (sVar5 == 0) goto LAB_00120a44;
      lVar3 = sVar5 - 1;
      sVar5 = sVar5 - 1;
    } while (assertion.location.file_[lVar3] != '/');
    lVar3 = 0;
    do {
      lVar6 = lVar3;
      if (-lVar6 == sVar4) break;
      lVar3 = lVar6 + -1;
    } while (assertion.location.file_[lVar6 + (sVar4 - 1)] != '/');
    assertion.location.file_ = assertion.location.file_ + lVar6 + sVar4;
    sVar4 = -lVar6;
  }
LAB_00120a44:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,assertion.location.file_,sVar4);
  local_2b[0] = ':';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_2b,1);
  std::ostream::operator<<((ostream *)this_00,assertion.location.line_);
  local_2b[1] = 0x3a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_2b + 1,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->printer_).colors_.fail._M_str,
             (this->printer_).colors_.fail._M_len);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"FAILED",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->printer_).colors_.none._M_str,
             (this->printer_).colors_.none._M_len);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," [",2);
  puVar2 = (uint *)(&(this->printer_).field_0x58 +
                   *(long *)(*(long *)&(this->printer_).field_0x40 + -0x18));
  *puVar2 = *puVar2 | 1;
  std::ostream::_M_insert<bool>(SUB81(this_00,0));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->printer_).colors_.none._M_str,
             (this->printer_).colors_.none._M_len);
  local_2b[2] = 0x5d;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_2b + 2,1);
  psVar1 = &(this->asserts_).fail;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

auto on(events::assertion_fail<TExpr> assertion) -> void {
      constexpr auto short_name = [](std::string_view name) {
        return name.rfind('/') != std::string_view::npos
                   ? name.substr(name.rfind('/') + 1)
                   : name;
      };
      printer_ << "\n  " << short_name(assertion.location.file_name()) << ':'
               << assertion.location.line() << ':' << printer_.colors().fail
               << "FAILED" << printer_.colors().none << " [" << std::boolalpha
               << assertion.expr << printer_.colors().none << ']';
      ++asserts_.fail;
    }